

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O3

void duckdb::AggregateExecutor::
     UnaryUpdate<duckdb::AvgState<long>,short,duckdb::IntegerAverageOperation>
               (Vector *input,AggregateInputData *aggr_input_data,data_ptr_t state,idx_t count)

{
  short sVar1;
  short *psVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  idx_t iVar9;
  ulong uVar10;
  idx_t iVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  UnifiedVectorFormat idata;
  long *local_68;
  long local_60;
  long local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  
  if (*input == (Vector)0x0) {
    lVar6 = *(long *)(input + 0x20);
    FlatVector::VerifyFlatVector(input);
    if (0x3f < count + 0x3f) {
      lVar3 = *(long *)(input + 0x28);
      uVar5 = 0;
      uVar10 = 0;
      do {
        if (lVar3 == 0) {
          uVar7 = uVar10 + 0x40;
          if (count <= uVar10 + 0x40) {
            uVar7 = count;
          }
LAB_003f80d7:
          lVar12 = uVar7 - uVar10;
          uVar8 = uVar10;
          if (uVar10 <= uVar7 && lVar12 != 0) {
            lVar13 = *(long *)(state + 8);
            do {
              lVar13 = lVar13 + *(short *)(lVar6 + uVar10 * 2);
              uVar10 = uVar10 + 1;
            } while (uVar7 != uVar10);
            *(long *)state = lVar12 + *(long *)state;
            *(long *)(state + 8) = lVar13;
            uVar8 = uVar7;
          }
        }
        else {
          uVar4 = *(ulong *)(lVar3 + uVar5 * 8);
          uVar7 = uVar10 + 0x40;
          if (count <= uVar10 + 0x40) {
            uVar7 = count;
          }
          if (uVar4 == 0xffffffffffffffff) goto LAB_003f80d7;
          uVar8 = uVar7;
          if ((uVar4 != 0) && (uVar8 = uVar10, uVar10 < uVar7)) {
            uVar14 = 0;
            do {
              if ((uVar4 >> (uVar14 & 0x3f) & 1) != 0) {
                sVar1 = *(short *)(lVar6 + uVar10 * 2 + uVar14 * 2);
                *(long *)state = *(long *)state + 1;
                *(long *)(state + 8) = (long)sVar1 + *(long *)(state + 8);
              }
              uVar14 = uVar14 + 1;
              uVar8 = uVar7;
            } while (uVar7 - uVar10 != uVar14);
          }
        }
        uVar5 = uVar5 + 1;
        uVar10 = uVar8;
      } while (uVar5 != count + 0x3f >> 6);
    }
  }
  else if (*input == (Vector)0x2) {
    if ((*(byte **)(input + 0x28) == (byte *)0x0) || ((**(byte **)(input + 0x28) & 1) != 0)) {
      psVar2 = *(short **)(input + 0x20);
      *(idx_t *)state = *(long *)state + count;
      *(idx_t *)(state + 8) = *(long *)(state + 8) + (long)*psVar2 * count;
    }
  }
  else {
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_68);
    duckdb::Vector::ToUnifiedFormat((ulong)input,(UnifiedVectorFormat *)count);
    if (local_58 == 0) {
      if (count != 0) {
        lVar6 = *(long *)(state + 8);
        iVar9 = 0;
        do {
          iVar11 = iVar9;
          if (*local_68 != 0) {
            iVar11 = (idx_t)*(uint *)(*local_68 + iVar9 * 4);
          }
          lVar6 = lVar6 + *(short *)(local_60 + iVar11 * 2);
          iVar9 = iVar9 + 1;
        } while (count != iVar9);
        *(idx_t *)state = *(long *)state + count;
        *(long *)(state + 8) = lVar6;
      }
    }
    else if (count != 0) {
      lVar6 = *local_68;
      iVar9 = 0;
      do {
        iVar11 = iVar9;
        if (lVar6 != 0) {
          iVar11 = (idx_t)*(uint *)(lVar6 + iVar9 * 4);
        }
        if ((*(ulong *)(local_58 + (iVar11 >> 6) * 8) >> (iVar11 & 0x3f) & 1) != 0) {
          sVar1 = *(short *)(local_60 + iVar11 * 2);
          *(long *)state = *(long *)state + 1;
          *(long *)(state + 8) = (long)sVar1 + *(long *)(state + 8);
        }
        iVar9 = iVar9 + 1;
      } while (count != iVar9);
    }
    if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
    }
    if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
    }
  }
  return;
}

Assistant:

static void UnaryUpdate(Vector &input, AggregateInputData &aggr_input_data, data_ptr_t state, idx_t count) {
		switch (input.GetVectorType()) {
		case VectorType::CONSTANT_VECTOR: {
			if (OP::IgnoreNull() && ConstantVector::IsNull(input)) {
				return;
			}
			auto idata = ConstantVector::GetData<INPUT_TYPE>(input);
			AggregateUnaryInput input_data(aggr_input_data, ConstantVector::Validity(input));
			OP::template ConstantOperation<INPUT_TYPE, STATE_TYPE, OP>(*reinterpret_cast<STATE_TYPE *>(state), *idata,
			                                                           input_data, count);
			break;
		}
#ifndef DUCKDB_SMALLER_BINARY
		case VectorType::FLAT_VECTOR: {
			auto idata = FlatVector::GetData<INPUT_TYPE>(input);
			UnaryFlatUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(idata, aggr_input_data, (STATE_TYPE *)state, count,
			                                                FlatVector::Validity(input));
			break;
		}
#endif
		default: {
			UnifiedVectorFormat idata;
			input.ToUnifiedFormat(count, idata);
			UnaryUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(UnifiedVectorFormat::GetData<INPUT_TYPE>(idata),
			                                            aggr_input_data, (STATE_TYPE *)state, count, idata.validity,
			                                            *idata.sel);
			break;
		}
		}
	}